

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_kiss.c
# Opt level: O0

int csp_kiss_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  char *packet_00;
  long in_RDX;
  long in_RDI;
  uchar stop [1];
  uint i;
  uchar *data;
  uchar esc_esc [2];
  uchar esc_end [2];
  uchar start [2];
  void *driver;
  csp_kiss_interface_data_t *ifdata;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar1;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined8 local_30;
  undefined8 *local_28;
  long local_18;
  
  local_28 = *(undefined8 **)(in_RDI + 0x10);
  local_30 = *(undefined8 *)(in_RDI + 0x18);
  local_18 = in_RDX;
  csp_usart_lock((void *)0x1121b0);
  csp_crc32_append((csp_packet_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  csp_id_prepend((csp_packet_t *)0x1121c4);
  local_32 = 0xc0;
  local_34 = 0xdcdb;
  local_36 = 0xdddb;
  packet_00 = *(char **)(local_18 + 0x10);
  (*(code *)*local_28)(local_30,&local_32,2);
  for (uVar1 = 0; uVar1 < *(ushort *)(local_18 + 0x18); uVar1 = uVar1 + 1) {
    if (*packet_00 == -0x40) {
      (*(code *)*local_28)(local_30,&local_34,2);
    }
    else if (*packet_00 == -0x25) {
      (*(code *)*local_28)(local_30,&local_36,2);
    }
    else {
      (*(code *)*local_28)(local_30,packet_00,1);
    }
    packet_00 = packet_00 + 1;
  }
  (*(code *)*local_28)(local_30,&stack0xffffffffffffffbb,1);
  csp_usart_unlock((void *)0x1122e4);
  csp_buffer_free(packet_00);
  return 0;
}

Assistant:

int csp_kiss_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	csp_kiss_interface_data_t * ifdata = iface->interface_data;
	void * driver = iface->driver_data;

	/* Lock (before modifying packet) */
	csp_usart_lock(driver);

	/* Add CRC32 checksum */
	csp_crc32_append(packet);

	/* Save the outgoing id in the buffer */
	csp_id_prepend(packet);

	/* Transmit data */
	const unsigned char start[] = {FEND, TNC_DATA};
	const unsigned char esc_end[] = {FESC, TFEND};
	const unsigned char esc_esc[] = {FESC, TFESC};
	const unsigned char * data = packet->frame_begin;

	ifdata->tx_func(driver, start, sizeof(start));

	for (unsigned int i = 0; i < packet->frame_length; i++, ++data) {
		if (*data == FEND) {
			ifdata->tx_func(driver, esc_end, sizeof(esc_end));
			continue;
		}
		if (*data == FESC) {
			ifdata->tx_func(driver, esc_esc, sizeof(esc_esc));
			continue;
		}
		ifdata->tx_func(driver, data, 1);
	}
	const unsigned char stop[] = {FEND};
	ifdata->tx_func(driver, stop, sizeof(stop));

	/* Unlock */
	csp_usart_unlock(driver);

	/* Free data */
	csp_buffer_free(packet);

	return CSP_ERR_NONE;
}